

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

bool Catch::TestCaseTracking::operator==(NameAndLocation *lhs,NameAndLocation *rhs)

{
  size_t __n;
  char *__s1;
  char *__s2;
  int iVar1;
  bool bVar2;
  
  if ((lhs->location).line != (rhs->location).line) {
    return false;
  }
  __n = (lhs->name)._M_string_length;
  if (__n == (rhs->name)._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((lhs->name)._M_dataplus._M_p,(rhs->name)._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_00176730;
    }
    __s1 = (lhs->location).file;
    __s2 = (rhs->location).file;
    if (__s1 == __s2) {
      bVar2 = true;
    }
    else {
      iVar1 = strcmp(__s1,__s2);
      bVar2 = iVar1 == 0;
    }
  }
  else {
LAB_00176730:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(NameAndLocation const& lhs, NameAndLocation const& rhs) {
            // This is a very cheap check that should have a very high hit rate.
            // If we get to SourceLineInfo::operator==, we will redo it, but the
            // cost of repeating is trivial at that point (we will be paying
            // multiple strcmp/memcmps at that point).
            if ( lhs.location.line != rhs.location.line ) { return false; }
            return lhs.name == rhs.name && lhs.location == rhs.location;
        }